

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O3

void __thiscall
SuiteSessionTests::initiatorFixtureLookUpSession_SessionFoundHelper::RunImpl
          (initiatorFixtureLookUpSession_SessionFoundHelper *this)

{
  TestResults *this_00;
  long *plVar1;
  long lVar2;
  TestResults **ppTVar3;
  TestDetails **ppTVar4;
  long *plVar5;
  string delimSOH;
  string header;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  TestDetails local_150;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  initiatorFixture::startLoggedOn(&this->super_initiatorFixture);
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"\x01","");
  std::operator+(&local_50,"8=FIX.4.2",&local_170);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_50);
  plVar5 = plVar1 + 2;
  if ((long *)*plVar1 == plVar5) {
    local_c0 = *plVar5;
    lStack_b8 = plVar1[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *plVar5;
    local_d0 = (long *)*plVar1;
  }
  local_c8 = plVar1[1];
  *plVar1 = (long)plVar5;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_d0,(ulong)local_170._M_dataplus._M_p);
  local_130 = &local_120;
  plVar5 = plVar1 + 2;
  if ((long *)*plVar1 == plVar5) {
    local_120 = *plVar5;
    lStack_118 = plVar1[3];
  }
  else {
    local_120 = *plVar5;
    local_130 = (long *)*plVar1;
  }
  local_128 = plVar1[1];
  *plVar1 = (long)plVar5;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_130);
  local_110 = &local_100;
  plVar5 = plVar1 + 2;
  if ((long *)*plVar1 == plVar5) {
    local_100 = *plVar5;
    lStack_f8 = plVar1[3];
  }
  else {
    local_100 = *plVar5;
    local_110 = (long *)*plVar1;
  }
  local_108 = plVar1[1];
  *plVar1 = (long)plVar5;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_110,(ulong)local_170._M_dataplus._M_p);
  plVar5 = plVar1 + 2;
  if ((long *)*plVar1 == plVar5) {
    local_a0 = *plVar5;
    lStack_98 = plVar1[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar5;
    local_b0 = (long *)*plVar1;
  }
  local_a8 = plVar1[1];
  *plVar1 = (long)plVar5;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_b0);
  plVar5 = plVar1 + 2;
  if ((long *)*plVar1 == plVar5) {
    local_80 = *plVar5;
    lStack_78 = plVar1[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar5;
    local_90 = (long *)*plVar1;
  }
  local_88 = plVar1[1];
  *plVar1 = (long)plVar5;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_90,(ulong)local_170._M_dataplus._M_p);
  plVar5 = plVar1 + 2;
  if ((long *)*plVar1 == plVar5) {
    local_60 = *plVar5;
    lStack_58 = plVar1[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar5;
    local_70 = (long *)*plVar1;
  }
  local_68 = plVar1[1];
  *plVar1 = (long)plVar5;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_70);
  plVar5 = plVar1 + 2;
  if ((char **)*plVar1 == (char **)plVar5) {
    local_150.filename = (char *)*plVar5;
    local_150._24_8_ = plVar1[3];
    local_150.suiteName = (char *)&local_150.filename;
  }
  else {
    local_150.filename = (char *)*plVar5;
    local_150.suiteName = (char *)*plVar1;
  }
  local_150.testName = (char *)plVar1[1];
  *plVar1 = (long)plVar5;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_150,(ulong)local_170._M_dataplus._M_p);
  plVar5 = plVar1 + 2;
  if ((long *)*plVar1 == plVar5) {
    local_e0 = *plVar5;
    lStack_d8 = plVar1[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *plVar5;
    local_f0 = (long *)*plVar1;
  }
  local_e8 = plVar1[1];
  *plVar1 = (long)plVar5;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  if ((char **)local_150.suiteName != &local_150.filename) {
    operator_delete(local_150.suiteName,(ulong)(local_150.filename + 1));
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  lVar2 = FIX::Session::lookupSession((string *)&local_f0,false);
  if (lVar2 == 0) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    this_00 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_150,*ppTVar4,0xaba);
    UnitTest::TestResults::OnTestFailure(this_00,&local_150,"nullptr != actualSession");
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, LookUpSession_SessionFound)
{
  startLoggedOn();
  std::string delimSOH = "\x01";
  std::string header = "8=FIX.4.2" + delimSOH
      + "9=100" + delimSOH
      + "35=A" + delimSOH
      + "49=TW" + delimSOH
      + "56=ISLD" + delimSOH;

  Session* actualSession = object->lookupSession(header, false);
  CHECK(nullptr != actualSession);
}